

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  ImGuiNavLayer IVar3;
  ImGuiScrollFlags IVar4;
  ImGuiDir IVar5;
  ImGuiContextHook *pIVar6;
  _func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *p_Var7;
  ImGuiViewportP *pIVar8;
  ImGuiWindow **ppIVar9;
  unsigned_short *puVar10;
  bool bVar11;
  ImGuiContext *pIVar12;
  int iVar13;
  ImGuiContext *pIVar14;
  ImGuiContext *pIVar15;
  bool bVar16;
  ImGuiID key;
  int iVar17;
  ImVec2 in_RAX;
  ImGuiWindow *pIVar18;
  ImGuiWindow **ppIVar19;
  unsigned_short *__dest;
  uint uVar20;
  char *pcVar21;
  ImGuiContext *g;
  ImGuiContext *g_6;
  int iVar22;
  char *__s1;
  ImGuiContext *g_1;
  long lVar23;
  long lVar24;
  ulong uVar25;
  float fVar26;
  ImVec2 IVar27;
  ImVec2 IVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  ImVec2 local_38;
  
  pIVar14 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    local_38 = in_RAX;
    if (0 < (GImGui->Hooks).Size) {
      lVar23 = 0;
      lVar24 = 0;
      do {
        pIVar6 = (pIVar14->Hooks).Data;
        if (*(int *)(pIVar6 + lVar23 + 4) == 2) {
          (**(code **)(pIVar6 + lVar23 + 0x10))();
        }
        lVar24 = lVar24 + 1;
        lVar23 = lVar23 + 0x20;
      } while (lVar24 < (pIVar14->Hooks).Size);
    }
    pIVar12 = GImGui;
    iVar17 = (GImGui->CurrentWindowStack).Size;
    while (1 < iVar17) {
      End();
      iVar17 = (pIVar12->CurrentWindowStack).Size;
    }
    p_Var7 = (pIVar14->IO).SetPlatformImeDataFn;
    if ((p_Var7 != (_func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *)0x0) &&
       (auVar31[0] = -((pIVar14->PlatformImeDataPrev).WantVisible ==
                      (pIVar14->PlatformImeData).WantVisible),
       auVar31[1] = -((pIVar14->PlatformImeDataPrev).field_0x1 ==
                     (pIVar14->PlatformImeData).field_0x1),
       auVar31[2] = -((pIVar14->PlatformImeDataPrev).field_0x2 ==
                     (pIVar14->PlatformImeData).field_0x2),
       auVar31[3] = -((pIVar14->PlatformImeDataPrev).field_0x3 ==
                     (pIVar14->PlatformImeData).field_0x3),
       auVar31[4] = -(*(char *)&(pIVar14->PlatformImeDataPrev).InputPos.x ==
                     *(char *)&(pIVar14->PlatformImeData).InputPos.x),
       auVar31[5] = -(*(char *)((long)&(pIVar14->PlatformImeDataPrev).InputPos.x + 1) ==
                     *(char *)((long)&(pIVar14->PlatformImeData).InputPos.x + 1)),
       auVar31[6] = -(*(char *)((long)&(pIVar14->PlatformImeDataPrev).InputPos.x + 2) ==
                     *(char *)((long)&(pIVar14->PlatformImeData).InputPos.x + 2)),
       auVar31[7] = -(*(char *)((long)&(pIVar14->PlatformImeDataPrev).InputPos.x + 3) ==
                     *(char *)((long)&(pIVar14->PlatformImeData).InputPos.x + 3)),
       auVar31[8] = -(*(char *)&(pIVar14->PlatformImeDataPrev).InputPos.y ==
                     *(char *)&(pIVar14->PlatformImeData).InputPos.y),
       auVar31[9] = -(*(char *)((long)&(pIVar14->PlatformImeDataPrev).InputPos.y + 1) ==
                     *(char *)((long)&(pIVar14->PlatformImeData).InputPos.y + 1)),
       auVar31[10] = -(*(char *)((long)&(pIVar14->PlatformImeDataPrev).InputPos.y + 2) ==
                      *(char *)((long)&(pIVar14->PlatformImeData).InputPos.y + 2)),
       auVar31[0xb] = -(*(char *)((long)&(pIVar14->PlatformImeDataPrev).InputPos.y + 3) ==
                       *(char *)((long)&(pIVar14->PlatformImeData).InputPos.y + 3)),
       auVar31[0xc] = -(*(char *)&(pIVar14->PlatformImeDataPrev).InputLineHeight ==
                       *(char *)&(pIVar14->PlatformImeData).InputLineHeight),
       auVar31[0xd] = -(*(char *)((long)&(pIVar14->PlatformImeDataPrev).InputLineHeight + 1) ==
                       *(char *)((long)&(pIVar14->PlatformImeData).InputLineHeight + 1)),
       auVar31[0xe] = -(*(char *)((long)&(pIVar14->PlatformImeDataPrev).InputLineHeight + 2) ==
                       *(char *)((long)&(pIVar14->PlatformImeData).InputLineHeight + 2)),
       auVar31[0xf] = -(*(char *)((long)&(pIVar14->PlatformImeDataPrev).InputLineHeight + 3) ==
                       *(char *)((long)&(pIVar14->PlatformImeData).InputLineHeight + 3)),
       (ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf)
       != 0xffff)) {
      (*p_Var7)(&(*(GImGui->Viewports).Data)->super_ImGuiViewport,&pIVar14->PlatformImeData);
    }
    pIVar14->WithinFrameScopeWithImplicitWindow = false;
    pIVar18 = pIVar14->CurrentWindow;
    if ((pIVar18 != (ImGuiWindow *)0x0) && (pIVar18->WriteAccessed == false)) {
      pIVar18->Active = false;
    }
    End();
    pIVar12 = GImGui;
    if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
      if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
        key = ImHashStr("###NavWindowingList",0,0);
        pIVar18 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar12->WindowsById,key);
        pIVar12->NavWindowingListWindow = pIVar18;
      }
      pIVar8 = *(pIVar12->Viewports).Data;
      uVar20 = (pIVar12->NextWindowData).Flags;
      IVar2 = (pIVar8->super_ImGuiViewport).Size;
      IVar27.x = IVar2.x * 0.2;
      IVar27.y = IVar2.y * 0.2;
      (pIVar12->NextWindowData).Flags = uVar20 | 0x10;
      (pIVar12->NextWindowData).SizeConstraintRect.Min = IVar27;
      (pIVar12->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
      (pIVar12->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
      (pIVar12->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
      (pIVar12->NextWindowData).SizeCallbackUserData = (void *)0x0;
      IVar2 = (pIVar8->super_ImGuiViewport).Size;
      IVar27 = (pIVar8->super_ImGuiViewport).Pos;
      IVar28.x = IVar2.x * 0.5 + IVar27.x;
      IVar28.y = IVar2.y * 0.5 + IVar27.y;
      (pIVar12->NextWindowData).Flags = uVar20 | 0x11;
      (pIVar12->NextWindowData).PosVal = IVar28;
      (pIVar12->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar12->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar12->NextWindowData).PosCond = 1;
      IVar2 = (pIVar12->Style).WindowPadding;
      fVar32 = IVar2.x;
      fVar29 = IVar2.y;
      local_38.x = fVar32 + fVar32;
      local_38.y = fVar29 + fVar29;
      PushStyleVar(2,&local_38);
      Begin("###NavWindowingList",(bool *)0x0,0xc1347);
      lVar23 = (long)(pIVar12->WindowsFocusOrder).Size;
      if (0 < lVar23) {
        do {
          pIVar18 = (pIVar12->WindowsFocusOrder).Data[lVar23 + -1];
          if (((pIVar18->WasActive == true) && (pIVar18->RootWindow == pIVar18)) &&
             (uVar20 = pIVar18->Flags, (uVar20 >> 0x13 & 1) == 0)) {
            __s1 = pIVar18->Name;
            pcVar21 = __s1;
            if (__s1 != (char *)0xffffffffffffffff) {
              do {
                if (*pcVar21 == '#') {
                  if (pcVar21[1] == '#') goto LAB_001f04d1;
                }
                else if (*pcVar21 == '\0') goto LAB_001f04d1;
                pcVar21 = pcVar21 + 1;
              } while (pcVar21 != (char *)0xffffffffffffffff);
              pcVar21 = (char *)0xffffffffffffffff;
            }
LAB_001f04d1:
            if (__s1 == pcVar21) {
              lVar24 = 0x5bd8;
              if ((uVar20 >> 0x1a & 1) == 0) {
                if (((uVar20 >> 10 & 1) == 0) ||
                   (iVar17 = strcmp(__s1,"##MainMenuBar"), iVar17 != 0)) {
                  lVar24 = 0x5be0;
                }
                else {
                  lVar24 = 0x5bd0;
                }
              }
              __s1 = *(char **)(&GImGui->Initialized + lVar24);
              if (__s1 == (char *)0x0) {
                __s1 = "*Missing Text*";
              }
            }
            local_38.x = 0.0;
            local_38.y = 0.0;
            Selectable(__s1,pIVar12->NavWindowingTarget == pIVar18,0,&local_38);
          }
          bVar11 = 1 < lVar23;
          lVar23 = lVar23 + -1;
        } while (bVar11);
      }
      End();
      PopStyleVar(1);
    }
    pIVar15 = GImGui;
    if (((pIVar12->NavWindow != (ImGuiWindow *)0x0) && (GImGui->NavMoveScoringItems == true)) &&
       (((GImGui->NavMoveResultLocal).ID == 0 &&
        (((GImGui->NavMoveResultOther).ID == 0 &&
         (-1 < (char)pIVar12->NavMoveFlags && (pIVar12->NavMoveFlags & 0xfU) != 0)))))) {
      pIVar18 = GImGui->NavWindow;
      IVar3 = GImGui->NavLayer;
      fVar29 = pIVar18->NavRectRel[IVar3].Min.x;
      fVar32 = pIVar18->NavRectRel[IVar3].Min.y;
      fVar30 = pIVar18->NavRectRel[IVar3].Max.x;
      fVar26 = pIVar18->NavRectRel[IVar3].Max.y;
      iVar17 = GImGui->NavMoveDir;
      uVar20 = GImGui->NavMoveFlags;
      iVar22 = 0;
      if (iVar17 == 0) {
        if ((uVar20 & 5) == 0) {
          bVar11 = false;
          iVar22 = 0;
        }
        else {
          fVar29 = (pIVar18->ContentSize).x + (pIVar18->WindowPadding).x;
          bVar11 = true;
          fVar30 = fVar29;
          if ((uVar20 & 4) != 0) {
            fVar33 = fVar26 - fVar32;
            fVar32 = fVar32 - fVar33;
            fVar26 = fVar26 - fVar33;
            iVar22 = 2;
          }
        }
      }
      else {
        bVar11 = false;
        iVar22 = iVar17;
      }
      if ((uVar20 & 5) != 0 && iVar17 == 1) {
        fVar29 = -(pIVar18->WindowPadding).x;
        bVar11 = true;
        fVar30 = fVar29;
        if ((uVar20 & 4) != 0) {
          fVar33 = fVar26 - fVar32;
          fVar32 = fVar32 + fVar33;
          fVar26 = fVar26 + fVar33;
          iVar22 = 3;
        }
      }
      if ((uVar20 & 10) != 0 && iVar17 == 2) {
        fVar32 = (pIVar18->ContentSize).y + (pIVar18->WindowPadding).y;
        bVar11 = true;
        fVar26 = fVar32;
        if ((uVar20 & 8) != 0) {
          fVar33 = fVar30 - fVar29;
          fVar29 = fVar29 - fVar33;
          fVar30 = fVar30 - fVar33;
          iVar22 = 0;
        }
      }
      if (iVar17 == 3 && (uVar20 & 10) != 0) {
        fVar32 = -(pIVar18->WindowPadding).y;
        bVar11 = true;
        fVar26 = fVar32;
        if ((uVar20 & 8) != 0) {
          fVar33 = fVar30 - fVar29;
          fVar29 = fVar29 + fVar33;
          fVar30 = fVar30 + fVar33;
          iVar22 = 1;
        }
      }
      if (bVar11) {
        pIVar18->NavRectRel[IVar3].Min.x = fVar29;
        pIVar18->NavRectRel[IVar3].Min.y = fVar32;
        pIVar18->NavRectRel[IVar3].Max.x = fVar30;
        pIVar18->NavRectRel[IVar3].Max.y = fVar26;
        pIVar12 = GImGui;
        IVar4 = pIVar15->NavMoveScrollFlags;
        IVar5 = pIVar15->NavMoveDir;
        pIVar12->NavMoveScoringItems = false;
        pIVar12->NavMoveForwardToNextFrame = true;
        pIVar12->NavMoveSubmitted = false;
        pIVar12->NavAnyRequest = pIVar12->NavInitRequest;
        pIVar12->NavMoveDir = IVar5;
        pIVar12->NavMoveClipDir = iVar22;
        pIVar12->NavMoveFlags = uVar20 | 0x80;
        pIVar12->NavMoveScrollFlags = IVar4;
      }
    }
    if (pIVar14->DragDropActive == true) {
      bVar11 = (pIVar14->DragDropPayload).Delivery;
      if ((pIVar14->DragDropPayload).DataFrameCount + 1 < pIVar14->FrameCount) {
        bVar16 = true;
        if (((pIVar14->DragDropSourceFlags & 0x20) == 0) &&
           ((GImGui->IO).MouseDown[pIVar14->DragDropMouseButton] == true)) {
          bVar16 = TestKeyOwner(pIVar14->DragDropMouseButton + ImGuiKey_MouseLeft,0);
          bVar16 = !bVar16;
        }
      }
      else {
        bVar16 = false;
      }
      if ((bVar16) || (bVar11 != false)) {
        ClearDragDrop();
      }
    }
    if (((pIVar14->DragDropActive == true) &&
        (pIVar14->DragDropSourceFrameCount < pIVar14->FrameCount)) &&
       ((pIVar14->DragDropSourceFlags & 1) == 0)) {
      pIVar14->DragDropWithinSource = true;
      SetTooltip("...");
      pIVar14->DragDropWithinSource = false;
    }
    pIVar14->WithinFrameScope = false;
    pIVar14->FrameCountEnded = pIVar14->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    iVar17 = (pIVar14->WindowsTempSortBuffer).Capacity;
    if (iVar17 < 0) {
      uVar20 = iVar17 / 2 + iVar17;
      uVar25 = 0;
      if (0 < (int)uVar20) {
        uVar25 = (ulong)uVar20;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar19 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar25 * 8,GImAllocatorUserData);
      ppIVar9 = (pIVar14->WindowsTempSortBuffer).Data;
      if (ppIVar9 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar19,ppIVar9,(long)(pIVar14->WindowsTempSortBuffer).Size << 3);
        ppIVar9 = (pIVar14->WindowsTempSortBuffer).Data;
        if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
      }
      (pIVar14->WindowsTempSortBuffer).Data = ppIVar19;
      (pIVar14->WindowsTempSortBuffer).Capacity = (int)uVar25;
    }
    (pIVar14->WindowsTempSortBuffer).Size = 0;
    iVar17 = (pIVar14->Windows).Size;
    if ((pIVar14->WindowsTempSortBuffer).Capacity < iVar17) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar19 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar17 << 3,GImAllocatorUserData);
      ppIVar9 = (pIVar14->WindowsTempSortBuffer).Data;
      if (ppIVar9 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar19,ppIVar9,(long)(pIVar14->WindowsTempSortBuffer).Size << 3);
        ppIVar9 = (pIVar14->WindowsTempSortBuffer).Data;
        if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
      }
      (pIVar14->WindowsTempSortBuffer).Data = ppIVar19;
      (pIVar14->WindowsTempSortBuffer).Capacity = iVar17;
    }
    uVar20 = (pIVar14->Windows).Size;
    if (uVar20 != 0) {
      uVar25 = 0;
      do {
        pIVar18 = (pIVar14->Windows).Data[uVar25];
        if ((pIVar18->Active != true) || ((pIVar18->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(&pIVar14->WindowsTempSortBuffer,pIVar18);
        }
        uVar25 = uVar25 + 1;
        uVar20 = (pIVar14->Windows).Size;
      } while (uVar25 != uVar20);
    }
    iVar17 = (pIVar14->Windows).Capacity;
    iVar22 = (pIVar14->WindowsTempSortBuffer).Size;
    iVar13 = (pIVar14->WindowsTempSortBuffer).Capacity;
    ppIVar19 = (pIVar14->WindowsTempSortBuffer).Data;
    (pIVar14->WindowsTempSortBuffer).Size = uVar20;
    (pIVar14->WindowsTempSortBuffer).Capacity = iVar17;
    ppIVar9 = (pIVar14->Windows).Data;
    (pIVar14->Windows).Size = iVar22;
    (pIVar14->Windows).Capacity = iVar13;
    (pIVar14->Windows).Data = ppIVar19;
    (pIVar14->WindowsTempSortBuffer).Data = ppIVar9;
    (pIVar14->IO).MetricsActiveWindows = pIVar14->WindowsActiveCount;
    ((pIVar14->IO).Fonts)->Locked = false;
    (pIVar14->IO).AppFocusLost = false;
    (pIVar14->IO).MouseWheel = 0.0;
    (pIVar14->IO).MouseWheelH = 0.0;
    iVar17 = (pIVar14->IO).InputQueueCharacters.Capacity;
    if (iVar17 < 0) {
      iVar17 = iVar17 / 2 + iVar17;
      iVar22 = 0;
      if (0 < iVar17) {
        iVar22 = iVar17;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)
               (*GImAllocatorAllocFunc)((ulong)(uint)(iVar22 * 2),GImAllocatorUserData);
      puVar10 = (pIVar14->IO).InputQueueCharacters.Data;
      if (puVar10 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar10,(long)(pIVar14->IO).InputQueueCharacters.Size * 2);
        puVar10 = (pIVar14->IO).InputQueueCharacters.Data;
        if ((puVar10 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar10,GImAllocatorUserData);
      }
      (pIVar14->IO).InputQueueCharacters.Data = __dest;
      (pIVar14->IO).InputQueueCharacters.Capacity = iVar22;
    }
    (pIVar14->IO).InputQueueCharacters.Size = 0;
    if (0 < (pIVar14->Hooks).Size) {
      lVar23 = 0;
      lVar24 = 0;
      do {
        pIVar6 = (pIVar14->Hooks).Data;
        if (*(int *)(pIVar6 + lVar23 + 4) == 3) {
          (**(code **)(pIVar6 + lVar23 + 0x10))(pIVar14,pIVar6 + lVar23);
        }
        lVar24 = lVar24 + 1;
        lVar23 = lVar23 + 0x20;
      } while (lVar24 < (pIVar14->Hooks).Size);
    }
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify Platform/OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.SetPlatformImeDataFn && memcmp(&g.PlatformImeData, &g.PlatformImeDataPrev, sizeof(ImGuiPlatformImeData)) != 0)
        g.IO.SetPlatformImeDataFn(GetMainViewport(), &g.PlatformImeData);

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.AppFocusLost = false;
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}